

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O3

void * Ver_FormulaParser(char *pFormula,void *pMan,Vec_Ptr_t *vNames,Vec_Ptr_t *vStackFn,
                        Vec_Int_t *vStackOp,char *pErrorMessage)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  Hop_Obj_t *pHVar6;
  void **ppvVar7;
  void *pvVar8;
  size_t sVar9;
  char cVar10;
  char *pcVar11;
  uint uVar12;
  int local_4c;
  byte *local_48;
  
  vNames->nSize = 0;
  vStackFn->nSize = 0;
  vStackOp->nSize = 0;
  cVar10 = *pFormula;
  if (cVar10 == '0') {
    if ((pFormula[1] == '\0') || (iVar3 = strcmp(pFormula,"1\'b0"), iVar3 == 0)) {
LAB_003545b8:
      return (void *)(*(ulong *)((long)pMan + 0x18) ^ 1);
    }
  }
  else {
    iVar3 = strcmp(pFormula,"1\'b0");
    if (iVar3 == 0) goto LAB_003545b8;
    if ((cVar10 == '1') && (pFormula[1] == '\0')) goto LAB_003545e3;
  }
  iVar3 = strcmp(pFormula,"1\'b1");
  if (iVar3 != 0) {
    pcVar11 = pFormula + 1;
    iVar3 = 0;
    do {
      if (cVar10 == '(') {
        iVar3 = iVar3 + 1;
      }
      else if (cVar10 == ')') {
        iVar3 = iVar3 + -1;
      }
      else if (cVar10 == '\0') goto LAB_003545c6;
      cVar10 = *pcVar11;
      pcVar11 = pcVar11 + 1;
    } while( true );
  }
LAB_003545e3:
  return *(void **)((long)pMan + 0x18);
LAB_003545c6:
  if (iVar3 != 0) {
    pcVar11 = "Parse_FormulaParser(): Different number of opening and closing parentheses ().";
    sVar9 = 0x4f;
LAB_003545d9:
    memcpy(pErrorMessage,pcVar11,sVar9);
    return (void *)0x0;
  }
  sVar9 = strlen(pFormula);
  (pFormula + sVar9 + 1)[0] = ')';
  (pFormula + sVar9 + 1)[1] = '\0';
  if (sVar9 != 0) {
    memmove(pFormula + 1,pFormula,sVar9);
  }
  *pFormula = '(';
  local_4c = 1;
  local_48 = (byte *)pFormula;
LAB_00354637:
  bVar1 = *local_48;
  if (0x39 < bVar1) {
    if (bVar1 < 0x5e) {
      if ((bVar1 == 0x3a) || (bVar1 == 0x3f)) goto switchD_00354661_caseD_26;
    }
    else {
      if ((bVar1 == 0x5e) || (bVar1 == 0x7c)) {
switchD_00354661_caseD_26:
        if (local_4c == 2) {
          local_4c = 3;
          if (bVar1 < 0x5e) {
            if (bVar1 == 0x26) {
              iVar3 = 6;
              goto LAB_003549a9;
            }
            if (bVar1 == 0x3f) {
              iVar3 = 2;
              goto LAB_003549a9;
            }
          }
          else {
            if (bVar1 == 0x5e) {
              iVar3 = 5;
              goto LAB_003549a9;
            }
            if (bVar1 == 0x7c) {
              iVar3 = 4;
              goto LAB_003549a9;
            }
          }
LAB_0035495b:
          do {
            iVar2 = vStackOp->nSize;
            if (iVar2 < 1) {
LAB_00354b78:
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
            }
            uVar4 = iVar2 - 1;
            vStackOp->nSize = uVar4;
            iVar3 = vStackOp->pArray[uVar4];
            if (uVar4 == 0) goto LAB_003549bf;
            vStackOp->nSize = iVar2 - 2U;
            iVar2 = vStackOp->pArray[iVar2 - 2U];
            if ((iVar2 < iVar3) || (iVar2 == 2 && iVar3 == 2)) goto LAB_003549b0;
            pHVar6 = Ver_FormulaParserTopOper((Hop_Man_t *)pMan,vStackFn,iVar2);
            if (pHVar6 == (Hop_Obj_t *)0x0) goto LAB_003549d1;
LAB_003549a9:
            Vec_IntPush(vStackOp,iVar3);
          } while( true );
        }
        pcVar11 = "Parse_FormulaParser(): There is no variable before AND, EXOR, or OR.";
        sVar9 = 0x45;
        goto LAB_003545d9;
      }
      if (bVar1 == 0x7e) goto switchD_00354661_caseD_21;
    }
switchD_00354661_caseD_22:
    iVar3 = Ver_FormulaParserFindVar((char *)local_48,vNames);
    bVar1 = *local_48;
    if ((iVar3 < 0) || (vNames->nSize <= iVar3 * 2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (local_4c == 2) {
      builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Incorrect state.",0x28);
      return (void *)0x0;
    }
    iVar2 = *(int *)(vNames->pArray + (uint)(iVar3 * 2));
    pHVar6 = Hop_IthVar((Hop_Man_t *)pMan,iVar3);
    uVar4 = vStackFn->nSize;
    if (uVar4 == vStackFn->nCap) {
      if ((int)uVar4 < 0x10) {
        if (vStackFn->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(vStackFn->pArray,0x80);
        }
        vStackFn->pArray = ppvVar7;
        vStackFn->nCap = 0x10;
      }
      else {
        if (vStackFn->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc((ulong)uVar4 << 4);
        }
        else {
          ppvVar7 = (void **)realloc(vStackFn->pArray,(ulong)uVar4 << 4);
        }
        vStackFn->pArray = ppvVar7;
        vStackFn->nCap = uVar4 * 2;
      }
    }
    else {
      ppvVar7 = vStackFn->pArray;
    }
    local_48 = local_48 + (long)(iVar2 + -1) + (ulong)(bVar1 == 0x5c);
    iVar3 = vStackFn->nSize;
    vStackFn->nSize = iVar3 + 1;
    ppvVar7[iVar3] = pHVar6;
    uVar5 = (ulong)(uint)vStackOp->nSize;
LAB_00354896:
    local_4c = 2;
    uVar4 = (uint)uVar5;
    while (uVar4 != 0) {
      if ((int)uVar5 < 1) goto LAB_00354b78;
      uVar4 = (int)uVar5 - 1;
      vStackOp->nSize = uVar4;
      if (vStackOp->pArray[uVar4] != 7) {
        Vec_IntPush(vStackOp,vStackOp->pArray[uVar4]);
        break;
      }
      uVar4 = vStackFn->nSize;
      if ((int)uVar4 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      ppvVar7 = vStackFn->pArray;
      uVar12 = uVar4 - 1;
      vStackFn->nSize = uVar12;
      pvVar8 = ppvVar7[uVar12];
      if (uVar12 == vStackFn->nCap) {
        if (uVar4 < 0x11) {
          ppvVar7 = (void **)realloc(ppvVar7,0x80);
          uVar12 = 0x10;
        }
        else {
          uVar12 = uVar12 * 2;
          ppvVar7 = (void **)realloc(ppvVar7,(ulong)uVar12 * 8);
        }
        vStackFn->pArray = ppvVar7;
        vStackFn->nCap = uVar12;
      }
      iVar3 = vStackFn->nSize;
      vStackFn->nSize = iVar3 + 1;
      ppvVar7[iVar3] = (void *)((ulong)pvVar8 ^ 1);
      uVar4 = vStackOp->nSize;
      uVar5 = (ulong)uVar4;
    }
    goto LAB_003549c9;
  }
  if (0x1f < bVar1) {
    switch(bVar1) {
    case 0x20:
      break;
    case 0x21:
switchD_00354661_caseD_21:
      if (local_4c == 2) {
        builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Variable before negation.",0x31);
        return (void *)0x0;
      }
      Vec_IntPush(vStackOp,7);
      if (local_4c != 1) goto LAB_0035495b;
      local_4c = 1;
      break;
    default:
      goto switchD_00354661_caseD_22;
    case 0x26:
      goto switchD_00354661_caseD_26;
    case 0x28:
      if (local_4c == 2) {
        builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Variable before a parenthesis.",0x36);
        return (void *)0x0;
      }
      local_4c = 1;
      iVar3 = 1;
      goto LAB_003549bf;
    case 0x29:
      while( true ) {
        iVar3 = vStackOp->nSize;
        if (iVar3 == 0) {
          builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): There is no opening parenthesis\n",
                          0x38);
          return (void *)0x0;
        }
        if (iVar3 < 1) goto LAB_00354b78;
        uVar5 = (ulong)(iVar3 - 1U);
        vStackOp->nSize = iVar3 - 1U;
        if (vStackOp->pArray[uVar5] == 1) break;
        pHVar6 = Ver_FormulaParserTopOper((Hop_Man_t *)pMan,vStackFn,vStackOp->pArray[uVar5]);
        if (pHVar6 == (Hop_Obj_t *)0x0) goto LAB_003549d1;
      }
      goto LAB_00354896;
    }
    goto switchD_00354661_caseD_20;
  }
  if (bVar1 - 9 < 2) goto switchD_00354661_caseD_20;
  if (bVar1 == 0xd) goto LAB_003549c9;
  if (bVar1 != 0) goto switchD_00354661_caseD_22;
  if (vStackFn->nSize == 0) {
    builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): The input string is empty\n",0x32);
    return (void *)0x0;
  }
  pvVar8 = Vec_PtrPop(vStackFn);
  if (vStackFn->nSize != 0) {
    builtin_strncpy(pErrorMessage + 0x10,"ser(): Something is left in the function stack\n",0x30);
    goto LAB_003549f0;
  }
  if (vStackOp->nSize == 0) {
    return pvVar8;
  }
  pcVar11 = "Parse_FormulaParser(): Something is left in the operation stack\n";
  sVar9 = 0x41;
  goto LAB_003545d9;
LAB_003549b0:
  Vec_IntPush(vStackOp,iVar2);
LAB_003549bf:
  Vec_IntPush(vStackOp,iVar3);
switchD_00354661_caseD_20:
LAB_003549c9:
  local_48 = local_48 + 1;
  goto LAB_00354637;
LAB_003549d1:
  builtin_strncpy(pErrorMessage + 0x10,"ser(): Unknown operation\n",0x1a);
LAB_003549f0:
  builtin_strncpy(pErrorMessage,"Parse_FormulaPar",0x10);
  return (void *)0x0;
}

Assistant:

void * Ver_FormulaParser( char * pFormula, void * pMan, Vec_Ptr_t * vNames, Vec_Ptr_t * vStackFn, Vec_Int_t * vStackOp, char * pErrorMessage )
{
    char * pTemp;
    Hop_Obj_t * bFunc, * bTemp;
    int nParans, Flag;
    int Oper, Oper1, Oper2;
    int v;

    // clear the stacks and the names
    Vec_PtrClear( vNames );
    Vec_PtrClear( vStackFn );
    Vec_IntClear( vStackOp );

    if ( !strcmp(pFormula, "0") || !strcmp(pFormula, "1\'b0") )
        return Hop_ManConst0((Hop_Man_t *)pMan);
    if ( !strcmp(pFormula, "1") || !strcmp(pFormula, "1\'b1") )
        return Hop_ManConst1((Hop_Man_t *)pMan);

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        sprintf( pErrorMessage, "Parse_FormulaParser(): Different number of opening and closing parentheses ()." );
        return NULL;
    }
 
    // add parentheses
    pTemp = pFormula + strlen(pFormula) + 2;
    *pTemp-- = 0; *pTemp = ')';
    while ( --pTemp != pFormula )
        *pTemp = *(pTemp - 1);
    *pTemp = '(';

    // perform parsing
    Flag = VER_PARSE_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
    {
        switch ( *pTemp )
        {
        // skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
            continue;
/*
        // treat Constant 0 as a variable
        case VER_PARSE_SYM_CONST0:
            Vec_PtrPush( vStackFn, Hop_ManConst0(pMan) );  // Cudd_Ref( Hop_ManConst0(pMan) );
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): No operation symbol before constant 0." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Flag = VER_PARSE_FLAG_VAR; 
            break;

        // the same for Constant 1
        case VER_PARSE_SYM_CONST1:
            Vec_PtrPush( vStackFn, Hop_ManConst1(pMan) );  //  Cudd_Ref( Hop_ManConst1(pMan) );
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): No operation symbol before constant 1." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Flag = VER_PARSE_FLAG_VAR; 
            break;
*/
        case VER_PARSE_SYM_NEGBEF1:
        case VER_PARSE_SYM_NEGBEF2:
            if ( Flag == VER_PARSE_FLAG_VAR )
            {// if NEGBEF follows a variable, AND is assumed
                sprintf( pErrorMessage, "Parse_FormulaParser(): Variable before negation." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Vec_IntPush( vStackOp, VER_PARSE_OPER_NEG );
            break;

        case VER_PARSE_SYM_AND:
        case VER_PARSE_SYM_OR:
        case VER_PARSE_SYM_XOR:
        case VER_PARSE_SYM_MUX1:
        case VER_PARSE_SYM_MUX2:
            if ( Flag != VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): There is no variable before AND, EXOR, or OR." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            if ( *pTemp == VER_PARSE_SYM_AND )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_AND );
            else if ( *pTemp == VER_PARSE_SYM_OR )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_OR );
            else if ( *pTemp == VER_PARSE_SYM_XOR )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_XOR );
            else if ( *pTemp == VER_PARSE_SYM_MUX1 )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_MUX );
//            else if ( *pTemp == VER_PARSE_SYM_MUX2 )
//                Vec_IntPush( vStackOp, VER_PARSE_OPER_MUX );
            Flag = VER_PARSE_FLAG_OPER; 
            break;

        case VER_PARSE_SYM_OPEN:
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): Variable before a parenthesis." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Vec_IntPush( vStackOp, VER_PARSE_OPER_MARK );
            // after an opening bracket, it feels like starting over again
            Flag = VER_PARSE_FLAG_START; 
            break;

        case VER_PARSE_SYM_CLOSE:
            if ( Vec_IntSize( vStackOp ) )
            {
                while ( 1 )
                {
                    if ( !Vec_IntSize( vStackOp ) )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): There is no opening parenthesis\n" );
                        Flag = VER_PARSE_FLAG_ERROR; 
                        break;
                    }
                    Oper = Vec_IntPop( vStackOp );
                    if ( Oper == VER_PARSE_OPER_MARK )
                        break;
                    // skip the second MUX operation
//                    if ( Oper == VER_PARSE_OPER_MUX2 )
//                    {
//                        Oper = Vec_IntPop( vStackOp );
//                        assert( Oper == VER_PARSE_OPER_MUX1 );
//                    }

                    // perform the given operation
                    if ( Ver_FormulaParserTopOper( (Hop_Man_t *)pMan, vStackFn, Oper ) == NULL )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): Unknown operation\n" );
                        return NULL;
                    }
                }
            }
            else
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): There is no opening parenthesis\n" );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            if ( Flag != VER_PARSE_FLAG_ERROR )
                Flag = VER_PARSE_FLAG_VAR; 
            break;


        default:
            // scan the next name
            v = Ver_FormulaParserFindVar( pTemp, vNames );
            if ( *pTemp == '\\' )
                pTemp++;
            pTemp += (int)(ABC_PTRUINT_T)Vec_PtrEntry( vNames, 2*v ) - 1;

            // assume operation AND, if vars follow one another
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): Incorrect state." );
                return NULL;
            }
            bTemp = Hop_IthVar( (Hop_Man_t *)pMan, v );
            Vec_PtrPush( vStackFn, bTemp ); //  Cudd_Ref( bTemp );
            Flag = VER_PARSE_FLAG_VAR; 
            break;
        }

        if ( Flag == VER_PARSE_FLAG_ERROR )
            break;      // error exit
        else if ( Flag == VER_PARSE_FLAG_START )
            continue;  //  go on parsing
        else if ( Flag == VER_PARSE_FLAG_VAR )
            while ( 1 )
            {  // check if there are negations in the OpStack     
                if ( !Vec_IntSize(vStackOp) )
                    break;
                Oper = Vec_IntPop( vStackOp );
                if ( Oper != VER_PARSE_OPER_NEG )
                {
                    Vec_IntPush( vStackOp, Oper );
                    break;
                }
                else
                {
//                      Vec_PtrPush( vStackFn, Cudd_Not(Vec_PtrPop(vStackFn)) );
                      Vec_PtrPush( vStackFn, Hop_Not((Hop_Obj_t *)Vec_PtrPop(vStackFn)) );
                }
            }
        else // if ( Flag == VER_PARSE_FLAG_OPER )
            while ( 1 )
            {  // execute all the operations in the OpStack
               // with precedence higher or equal than the last one
                Oper1 = Vec_IntPop( vStackOp ); // the last operation
                if ( !Vec_IntSize(vStackOp) ) 
                {  // if it is the only operation, push it back
                    Vec_IntPush( vStackOp, Oper1 );
                    break;
                }
                Oper2 = Vec_IntPop( vStackOp ); // the operation before the last one
                if ( Oper2 >= Oper1 && !(Oper1 == Oper2 && Oper1 == VER_PARSE_OPER_MUX) )  
                {  // if Oper2 precedence is higher or equal, execute it
                    if ( Ver_FormulaParserTopOper( (Hop_Man_t *)pMan, vStackFn, Oper2 ) == NULL )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): Unknown operation\n" );
                        return NULL;
                    }
                    Vec_IntPush( vStackOp,  Oper1 );     // push the last operation back
                }
                else
                {  // if Oper2 precedence is lower, push them back and done
                    Vec_IntPush( vStackOp, Oper2 );
                    Vec_IntPush( vStackOp, Oper1 );
                    break;
                }
            }
    }

    if ( Flag != VER_PARSE_FLAG_ERROR )
    {
        if ( Vec_PtrSize(vStackFn) )
        {    
            bFunc = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
            if ( !Vec_PtrSize(vStackFn) )
                if ( !Vec_IntSize(vStackOp) )
                {
//                    Cudd_Deref( bFunc );
                    return bFunc;
                }
                else
                    sprintf( pErrorMessage, "Parse_FormulaParser(): Something is left in the operation stack\n" );
            else
                sprintf( pErrorMessage, "Parse_FormulaParser(): Something is left in the function stack\n" );
        }
        else
            sprintf( pErrorMessage, "Parse_FormulaParser(): The input string is empty\n" );
    }
//    Cudd_Ref( bFunc );
//    Cudd_RecursiveDeref( dd, bFunc );
    return NULL;
}